

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
dlib::image_window::on_keydown
          (image_window *this,unsigned_long key,bool is_printable,unsigned_long state)

{
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  int __sig;
  
  __sig = (int)key;
  drawable_window::on_keydown(&this->super_drawable_window,key,is_printable,state);
  this->have_last_keypress = true;
  this->next_key = key;
  this->next_is_printable = is_printable;
  this->next_state = state;
  rsignaler::signal(&this->clicked_signaler,__sig,
                    (__sighandler_t)CONCAT44(extraout_var,extraout_EDX));
  return;
}

Assistant:

void image_window::
    on_keydown (
        unsigned long key,
        bool is_printable,
        unsigned long state
    )
    {
        dlib::drawable_window::on_keydown(key,is_printable,state);

        have_last_keypress = true;
        next_key = key;
        next_is_printable = is_printable;
        next_state = state;
        clicked_signaler.signal();
    }